

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_storage_iface.hpp
# Opt level: O2

void __thiscall
so_5::impl::subscription_storage_common::subscr_info_t::subscr_info_t
          (subscr_info_t *this,mbox_t *mbox,type_index msg_type,state_t *state,
          event_handler_method_t *method,thread_safety_t thread_safety)

{
  _Any_data local_30;
  _Manager_type local_20;
  _Invoker_type p_Stack_18;
  
  (this->m_mbox).m_obj = mbox->m_obj;
  mbox->m_obj = (abstract_message_box_t *)0x0;
  (this->m_msg_type)._M_target = msg_type._M_target;
  this->m_state = state;
  std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::function
            ((function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)> *)
             &local_30,method);
  (this->m_handler).m_method.super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->m_handler).m_method.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_handler).m_method.super__Function_base._M_functor + 8) = 0;
  (this->m_handler).m_method._M_invoker = p_Stack_18;
  if (local_20 != (_Manager_type)0x0) {
    *(void **)&(this->m_handler).m_method.super__Function_base._M_functor =
         local_30._M_unused._M_object;
    *(undefined8 *)((long)&(this->m_handler).m_method.super__Function_base._M_functor + 8) =
         local_30._8_8_;
    (this->m_handler).m_method.super__Function_base._M_manager = local_20;
    local_20 = (_Manager_type)0x0;
    p_Stack_18 = (_Invoker_type)0x0;
  }
  (this->m_handler).m_thread_safety = thread_safety;
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return;
}

Assistant:

subscr_info_t(
			mbox_t mbox,
			std::type_index msg_type,
			const state_t & state,
			const event_handler_method_t & method,
			thread_safety_t thread_safety )
			:	m_mbox( std::move( mbox ) )
			,	m_msg_type( std::move( msg_type ) )
			,	m_state( &state )
			,	m_handler( method, thread_safety )
			{}